

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_nodeid_mod_check
                 (lysc_ctx *ctx,char *str,ly_bool abs,ly_set *mod_set,lysc_nodeid **nodeid,
                 lys_module **target_mod)

{
  uint uVar1;
  uint uVar2;
  lysc_nodeid *plVar3;
  LY_ERR LVar4;
  size_t expr_len;
  lys_module *object;
  char *format;
  undefined7 in_register_00000011;
  int iVar5;
  ulong uVar6;
  lys_module *plVar7;
  char *pcVar8;
  uint uVar9;
  ly_ctx *plVar10;
  char *pcVar11;
  lysc_nodeid *ni;
  lyxp_expr *e;
  lysc_nodeid **local_48;
  lys_module **local_40;
  ly_set *local_38;
  
  uVar6 = 0;
  e = (lyxp_expr *)0x0;
  ni = (lysc_nodeid *)0x0;
  pcVar8 = "descendant-schema-nodeid";
  if ((int)CONCAT71(in_register_00000011,abs) != 0) {
    pcVar8 = "absolute-schema-nodeid";
  }
  plVar10 = ctx->ctx;
  local_48 = nodeid;
  local_40 = target_mod;
  local_38 = mod_set;
  expr_len = strlen(str);
  LVar4 = lyxp_expr_parse(plVar10,str,expr_len,'\0',&e);
  if (LVar4 == LY_SUCCESS) {
    if ((abs == '\0') && (uVar6 = 1, *e->tokens != LYXP_TOKEN_NAMETEST)) {
      plVar10 = ctx->ctx;
      uVar2 = *e->tok_len;
      uVar1 = *e->tok_pos;
LAB_0014f287:
      pcVar11 = e->expr + uVar1;
      format = "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".";
LAB_0014f292:
      ly_vlog(plVar10,(char *)0x0,LYVE_REFERENCE,format,pcVar8,str,(ulong)uVar2,pcVar11);
LAB_0014f2ab:
      LVar4 = LY_EVALID;
    }
    else {
      uVar1 = e->used;
      if ((uint)uVar6 < uVar1) {
        do {
          if (e->tokens[uVar6] != LYXP_TOKEN_OPER_PATH) {
            plVar10 = ctx->ctx;
            uVar2 = e->tok_len[uVar6];
            pcVar11 = e->expr + e->tok_pos[uVar6];
            format = "Invalid %s value \"%s\" - \"/\" expected instead of \"%.*s\".";
            goto LAB_0014f292;
          }
          iVar5 = (int)uVar6;
          if (uVar1 - 1 == iVar5) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Invalid %s value \"%s\" - unexpected end of expression.",pcVar8,e->expr);
            goto LAB_0014f2ab;
          }
          uVar9 = iVar5 + 1;
          if (e->tokens[uVar9] != LYXP_TOKEN_NAMETEST) {
            plVar10 = ctx->ctx;
            uVar2 = e->tok_len[uVar9];
            uVar1 = e->tok_pos[uVar9];
            goto LAB_0014f287;
          }
          uVar6 = (ulong)(iVar5 + 2U);
        } while (iVar5 + 2U < uVar1);
      }
      if ((abs == '\0' && local_48 == (lysc_nodeid **)0x0) ||
         (LVar4 = lys_precompile_nodeid(ctx->ctx,str,&ni), LVar4 == LY_SUCCESS)) {
        plVar3 = ni;
        if ((abs == '\0') || (ni->count == 0)) {
          plVar7 = (lys_module *)0x0;
        }
        else {
          uVar6 = 0;
          plVar7 = (lys_module *)0x0;
          do {
            object = lys_schema_node_get_module(ctx->ctx,plVar3->prefix[uVar6],ctx->pmod);
            if (object == (lys_module *)0x0) goto LAB_0014f2ab;
            LVar4 = ly_set_add(local_38,object,'\0',(uint32_t *)0x0);
            if (LVar4 != LY_SUCCESS) goto LAB_0014f2b0;
            if (plVar7 == (lys_module *)0x0) {
              plVar7 = object;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < plVar3->count);
        }
        if (local_48 != (lysc_nodeid **)0x0) {
          *local_48 = ni;
          ni = (lysc_nodeid *)0x0;
        }
        LVar4 = LY_SUCCESS;
        if (local_40 != (lys_module **)0x0) {
          *local_40 = plVar7;
        }
      }
    }
  }
  else {
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid %s value \"%s\" - invalid syntax.",pcVar8
            ,str);
    LVar4 = LY_EVALID;
  }
LAB_0014f2b0:
  lyxp_expr_free(ctx->ctx,e);
  lysc_nodeid_free(ctx->ctx,ni);
  return LVar4;
}

Assistant:

static LY_ERR
lys_nodeid_mod_check(struct lysc_ctx *ctx, const char *str, ly_bool abs, struct ly_set *mod_set,
        struct lysc_nodeid **nodeid, struct lys_module **target_mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *e = NULL;
    struct lysc_nodeid *ni = NULL;
    struct lys_module *tmod = NULL, *mod;
    const char *nodeid_type = abs ? "absolute-schema-nodeid" : "descendant-schema-nodeid";
    uint32_t i;

    /* parse */
    ret = lyxp_expr_parse(ctx->ctx, str, strlen(str), 0, &e);
    if (ret) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s value \"%s\" - invalid syntax.", nodeid_type, str);
        ret = LY_EVALID;
        goto cleanup;
    }

    if (abs) {
        /* absolute schema nodeid */
        i = 0;
    } else {
        /* descendant schema nodeid */
        if (e->tokens[0] != LYXP_TOKEN_NAMETEST) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[0], e->expr + e->tok_pos[0]);
            ret = LY_EVALID;
            goto cleanup;
        }
        i = 1;
    }

    /* check all the tokens */
    for ( ; i < e->used; i += 2) {
        if (e->tokens[i] != LYXP_TOKEN_OPER_PATH) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - \"/\" expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[i], e->expr + e->tok_pos[i]);
            ret = LY_EVALID;
            goto cleanup;
        } else if (e->used == i + 1) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid %s value \"%s\" - unexpected end of expression.", nodeid_type, e->expr);
            ret = LY_EVALID;
            goto cleanup;
        } else if (e->tokens[i + 1] != LYXP_TOKEN_NAMETEST) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[i + 1], e->expr + e->tok_pos[i + 1]);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (abs || nodeid) {
        /* compile into nodeid, only if needed */
        LY_CHECK_GOTO(ret = lys_precompile_nodeid(ctx->ctx, str, &ni), cleanup);
    }

    if (abs) {
        for (i = 0; i < ni->count; ++i) {
            mod = (struct lys_module *)lys_schema_node_get_module(ctx->ctx, ni->prefix[i], ctx->pmod);
            LY_CHECK_ERR_GOTO(!mod, ret = LY_EVALID, cleanup);

            /* only keep the first module */
            if (!tmod) {
                tmod = mod;
            }

            /* store the referenced module */
            LY_CHECK_GOTO(ret = ly_set_add(mod_set, mod, 0, NULL), cleanup);
        }
    }

    if (nodeid) {
        *nodeid = ni;
        ni = NULL;
    }
    if (target_mod) {
        *target_mod = tmod;
    }

cleanup:
    lyxp_expr_free(ctx->ctx, e);
    lysc_nodeid_free(ctx->ctx, ni);
    return ret;
}